

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O0

int run_test(int inprocess)

{
  int iVar1;
  uv_loop_t *puVar2;
  int r;
  uv_thread_t tid;
  uv_process_t process;
  int inprocess_local;
  
  process._132_4_ = inprocess;
  if (inprocess == 0) {
    spawn_helper(&ctx.channel,(uv_process_t *)&tid,"ipc_send_recv_helper");
    connect_cb(&ctx.connect_req,0);
  }
  else {
    iVar1 = uv_thread_create((uv_thread_t *)&stack0xffffffffffffff60,ipc_send_recv_helper_threadproc
                             ,(void *)0x2a);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
              ,0xaf,"r == 0");
      abort();
    }
    uv_sleep(1000);
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&ctx.channel,1);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
              ,0xb4,"r == 0");
      abort();
    }
    uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0xbe,"r == 0");
    abort();
  }
  if (recv_cb_count == 2) {
    if ((process._132_4_ != 0) &&
       (iVar1 = uv_thread_join((uv_thread_t *)&stack0xffffffffffffff60), iVar1 != 0)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
              ,0xc4,"r == 0");
      abort();
    }
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,0xc0,"recv_cb_count == 2");
  abort();
}

Assistant:

static int run_test(int inprocess) {
  uv_process_t process;
  uv_thread_t tid;
  int r;

  if (inprocess) {
    r = uv_thread_create(&tid, ipc_send_recv_helper_threadproc, (void *) 42);
    ASSERT(r == 0);

    uv_sleep(1000);

    r = uv_pipe_init(uv_default_loop(), &ctx.channel, 1);
    ASSERT(r == 0);

    uv_pipe_connect(&ctx.connect_req, &ctx.channel, TEST_PIPENAME_3, connect_cb);
  } else {
    spawn_helper(&ctx.channel, &process, "ipc_send_recv_helper");

    connect_cb(&ctx.connect_req, 0);
  }

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(recv_cb_count == 2);

  if (inprocess) {
    r = uv_thread_join(&tid);
    ASSERT(r == 0);
  }

  return 0;
}